

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int mbedtls_cipher_update
              (mbedtls_cipher_context_t *ctx,uchar *input,size_t ilen,uchar *output,size_t *olen)

{
  mbedtls_cipher_mode_t mVar1;
  mbedtls_cipher_info_t *pmVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  
  pmVar2 = ctx->cipher_info;
  if (pmVar2 == (mbedtls_cipher_info_t *)0x0) {
    return -0x6100;
  }
  *olen = 0;
  uVar7 = (ulong)pmVar2->block_size;
  if (uVar7 == 0) {
    return -0x6380;
  }
  mVar1 = pmVar2->mode;
  if (mVar1 == MBEDTLS_MODE_GCM) {
    *olen = ilen;
    iVar3 = mbedtls_gcm_update((mbedtls_gcm_context *)ctx->cipher_ctx,ilen,input,output);
    return iVar3;
  }
  if (mVar1 == MBEDTLS_MODE_ECB) {
    if (uVar7 != ilen) {
      return -0x6280;
    }
    *olen = ilen;
    iVar3 = (*pmVar2->base->ecb_func)(ctx->cipher_ctx,ctx->operation,input,output);
    return iVar3;
  }
  if (pmVar2->type == MBEDTLS_CIPHER_CHACHA20_POLY1305) {
    *olen = ilen;
    iVar3 = mbedtls_chachapoly_update
                      ((mbedtls_chachapoly_context *)ctx->cipher_ctx,ilen,input,output);
    return iVar3;
  }
  if (input == output) {
    if (ctx->unprocessed_len != 0) {
      return -0x6100;
    }
    if (ilen % uVar7 != 0) {
      return -0x6100;
    }
  }
  iVar3 = -0x6080;
  switch(mVar1) {
  case MBEDTLS_MODE_CBC:
    if (ctx->operation == MBEDTLS_ENCRYPT) {
      sVar6 = ctx->unprocessed_len;
      uVar4 = uVar7 - sVar6;
LAB_00108720:
      if (ilen < uVar4) goto LAB_0010861a;
LAB_00108729:
      sVar6 = ctx->unprocessed_len;
      if (sVar6 != 0) {
        sVar5 = uVar7 - sVar6;
        memcpy(ctx->unprocessed_data + sVar6,input,sVar5);
        iVar3 = (*ctx->cipher_info->base->cbc_func)
                          (ctx->cipher_ctx,ctx->operation,uVar7,ctx->iv,ctx->unprocessed_data,output
                          );
        if (iVar3 != 0) {
          return iVar3;
        }
        *olen = *olen + uVar7;
        ctx->unprocessed_len = 0;
        output = output + uVar7;
        input = input + sVar5;
        ilen = ilen - sVar5;
      }
      if (ilen != 0) {
        sVar5 = ilen % uVar7;
        if (ilen % uVar7 == 0) {
          if (ctx->operation == MBEDTLS_DECRYPT) {
            sVar5 = uVar7;
            if (ctx->add_padding == (_func_void_uchar_ptr_size_t_size_t *)0x0) {
              sVar5 = 0;
            }
          }
          else {
            sVar5 = 0;
          }
        }
        memcpy(ctx->unprocessed_data,input + (ilen - sVar5),sVar5);
        ctx->unprocessed_len = ctx->unprocessed_len + sVar5;
        sVar6 = ilen - sVar5;
        if (sVar6 == 0) {
          return 0;
        }
        iVar3 = (*ctx->cipher_info->base->cbc_func)
                          (ctx->cipher_ctx,ctx->operation,sVar6,ctx->iv,input,output);
        if (iVar3 != 0) {
          return iVar3;
        }
        *olen = *olen + sVar6;
        return 0;
      }
    }
    else {
      if (ctx->operation != MBEDTLS_DECRYPT) goto LAB_00108729;
      sVar6 = ctx->unprocessed_len;
      uVar4 = uVar7 - sVar6;
      if (ctx->add_padding == (_func_void_uchar_ptr_size_t_size_t *)0x0) goto LAB_00108720;
      if (uVar4 < ilen) goto LAB_00108729;
LAB_0010861a:
      memcpy(ctx->unprocessed_data + sVar6,input,ilen);
      ctx->unprocessed_len = ctx->unprocessed_len + ilen;
    }
    goto LAB_0010870f;
  case MBEDTLS_MODE_CFB:
    iVar3 = (*pmVar2->base->cfb_func)
                      (ctx->cipher_ctx,ctx->operation,ilen,&ctx->unprocessed_len,ctx->iv,input,
                       output);
    break;
  case MBEDTLS_MODE_OFB:
    iVar3 = (*pmVar2->base->ofb_func)
                      (ctx->cipher_ctx,ilen,&ctx->unprocessed_len,ctx->iv,input,output);
    break;
  case MBEDTLS_MODE_CTR:
    iVar3 = (*pmVar2->base->ctr_func)
                      (ctx->cipher_ctx,ilen,&ctx->unprocessed_len,ctx->iv,ctx->unprocessed_data,
                       input,output);
    break;
  default:
    goto switchD_001085e5_caseD_6;
  case MBEDTLS_MODE_STREAM:
    iVar3 = (*pmVar2->base->stream_func)(ctx->cipher_ctx,ilen,input,output);
    break;
  case MBEDTLS_MODE_XTS:
    if (ctx->unprocessed_len != 0) {
      return -0x6080;
    }
    iVar3 = (*pmVar2->base->xts_func)(ctx->cipher_ctx,ctx->operation,ilen,ctx->iv,input,output);
  }
  if (iVar3 == 0) {
    *olen = ilen;
LAB_0010870f:
    iVar3 = 0;
  }
switchD_001085e5_caseD_6:
  return iVar3;
}

Assistant:

int mbedtls_cipher_update( mbedtls_cipher_context_t *ctx, const unsigned char *input,
                   size_t ilen, unsigned char *output, size_t *olen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t block_size;

    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( ilen == 0 || input != NULL );
    CIPHER_VALIDATE_RET( output != NULL );
    CIPHER_VALIDATE_RET( olen != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    *olen = 0;
    block_size = mbedtls_cipher_get_block_size( ctx );
    if ( 0 == block_size )
    {
        return( MBEDTLS_ERR_CIPHER_INVALID_CONTEXT );
    }

    if( ctx->cipher_info->mode == MBEDTLS_MODE_ECB )
    {
        if( ilen != block_size )
            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

        *olen = ilen;

        if( 0 != ( ret = ctx->cipher_info->base->ecb_func( ctx->cipher_ctx,
                    ctx->operation, input, output ) ) )
        {
            return( ret );
        }

        return( 0 );
    }

#if defined(MBEDTLS_GCM_C)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_GCM )
    {
        *olen = ilen;
        return( mbedtls_gcm_update( (mbedtls_gcm_context *) ctx->cipher_ctx, ilen, input,
                                    output ) );
    }
#endif

#if defined(MBEDTLS_CHACHAPOLY_C)
    if ( ctx->cipher_info->type == MBEDTLS_CIPHER_CHACHA20_POLY1305 )
    {
        *olen = ilen;
        return( mbedtls_chachapoly_update( (mbedtls_chachapoly_context*) ctx->cipher_ctx,
                                           ilen, input, output ) );
    }
#endif

    if( input == output &&
       ( ctx->unprocessed_len != 0 || ilen % block_size ) )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CBC )
    {
        size_t copy_len = 0;

        /*
         * If there is not enough data for a full block, cache it.
         */
        if( ( ctx->operation == MBEDTLS_DECRYPT && NULL != ctx->add_padding &&
                ilen <= block_size - ctx->unprocessed_len ) ||
            ( ctx->operation == MBEDTLS_DECRYPT && NULL == ctx->add_padding &&
                ilen < block_size - ctx->unprocessed_len ) ||
             ( ctx->operation == MBEDTLS_ENCRYPT &&
                ilen < block_size - ctx->unprocessed_len ) )
        {
            memcpy( &( ctx->unprocessed_data[ctx->unprocessed_len] ), input,
                    ilen );

            ctx->unprocessed_len += ilen;
            return( 0 );
        }

        /*
         * Process cached data first
         */
        if( 0 != ctx->unprocessed_len )
        {
            copy_len = block_size - ctx->unprocessed_len;

            memcpy( &( ctx->unprocessed_data[ctx->unprocessed_len] ), input,
                    copy_len );

            if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                    ctx->operation, block_size, ctx->iv,
                    ctx->unprocessed_data, output ) ) )
            {
                return( ret );
            }

            *olen += block_size;
            output += block_size;
            ctx->unprocessed_len = 0;

            input += copy_len;
            ilen -= copy_len;
        }

        /*
         * Cache final, incomplete block
         */
        if( 0 != ilen )
        {
            /* Encryption: only cache partial blocks
             * Decryption w/ padding: always keep at least one whole block
             * Decryption w/o padding: only cache partial blocks
             */
            copy_len = ilen % block_size;
            if( copy_len == 0 &&
                ctx->operation == MBEDTLS_DECRYPT &&
                NULL != ctx->add_padding)
            {
                copy_len = block_size;
            }

            memcpy( ctx->unprocessed_data, &( input[ilen - copy_len] ),
                    copy_len );

            ctx->unprocessed_len += copy_len;
            ilen -= copy_len;
        }

        /*
         * Process remaining full blocks
         */
        if( ilen )
        {
            if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                    ctx->operation, ilen, ctx->iv, input, output ) ) )
            {
                return( ret );
            }

            *olen += ilen;
        }

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CFB )
    {
        if( 0 != ( ret = ctx->cipher_info->base->cfb_func( ctx->cipher_ctx,
                ctx->operation, ilen, &ctx->unprocessed_len, ctx->iv,
                input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_OFB)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_OFB )
    {
        if( 0 != ( ret = ctx->cipher_info->base->ofb_func( ctx->cipher_ctx,
                ilen, &ctx->unprocessed_len, ctx->iv, input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_OFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CTR )
    {
        if( 0 != ( ret = ctx->cipher_info->base->ctr_func( ctx->cipher_ctx,
                ilen, &ctx->unprocessed_len, ctx->iv,
                ctx->unprocessed_data, input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CTR */

#if defined(MBEDTLS_CIPHER_MODE_XTS)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_XTS )
    {
        if( ctx->unprocessed_len > 0 ) {
            /* We can only process an entire data unit at a time. */
            return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
        }

        ret = ctx->cipher_info->base->xts_func( ctx->cipher_ctx,
                ctx->operation, ilen, ctx->iv, input, output );
        if( ret != 0 )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_XTS */

#if defined(MBEDTLS_CIPHER_MODE_STREAM)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_STREAM )
    {
        if( 0 != ( ret = ctx->cipher_info->base->stream_func( ctx->cipher_ctx,
                                                    ilen, input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_STREAM */

    return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
}